

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void anon_unknown.dwarf_d6fcf8::TranslateMemoryDecoration
               (TQualifier *qualifier,
               vector<spv::Decoration,_std::allocator<spv::Decoration>_> *memory,
               bool useVulkanMemoryModel)

{
  ulong uVar1;
  undefined3 in_register_00000011;
  Decoration local_1c;
  
  if (CONCAT31(in_register_00000011,useVulkanMemoryModel) == 0) {
    if ((*(ulong *)&qualifier->field_0x8 >> 0x32 & 1) == 0) {
      if ((*(ulong *)&qualifier->field_0x8 >> 0x31 & 1) == 0) goto LAB_003bc8ac;
    }
    else {
      local_1c = DecorationVolatile;
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::emplace_back<spv::Decoration>
                (memory,&local_1c);
    }
    local_1c = Coherent;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::emplace_back<spv::Decoration>
              (memory,&local_1c);
  }
LAB_003bc8ac:
  uVar1 = *(ulong *)&qualifier->field_0x8;
  if ((uVar1 >> 0x2e & 1) != 0) {
    local_1c = DecorationRestrict;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::emplace_back<spv::Decoration>
              (memory,&local_1c);
    uVar1 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar1 >> 0x2f & 1) != 0) {
    local_1c = DecorationNonWritable;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::emplace_back<spv::Decoration>
              (memory,&local_1c);
    uVar1 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar1 >> 0x30 & 1) != 0) {
    local_1c = DecorationNonReadable;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::emplace_back<spv::Decoration>
              (memory,&local_1c);
  }
  return;
}

Assistant:

void TranslateMemoryDecoration(const glslang::TQualifier& qualifier, std::vector<spv::Decoration>& memory,
    bool useVulkanMemoryModel)
{
    if (!useVulkanMemoryModel) {
        if (qualifier.isVolatile()) {
            memory.push_back(spv::DecorationVolatile);
            memory.push_back(spv::DecorationCoherent);
        } else if (qualifier.isCoherent()) {
            memory.push_back(spv::DecorationCoherent);
        }
    }
    if (qualifier.isRestrict())
        memory.push_back(spv::DecorationRestrict);
    if (qualifier.isReadOnly())
        memory.push_back(spv::DecorationNonWritable);
    if (qualifier.isWriteOnly())
       memory.push_back(spv::DecorationNonReadable);
}